

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

char * sha512_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  undefined1 local_f0 [8];
  SHA512_CTX context;
  char *digest_local;
  size_t len_local;
  sha2_byte *data_local;
  
  context.buffer[0xf] = (uint64_t)digest;
  sha512_Init((SHA512_CTX *)local_f0);
  sha512_Update((SHA512_CTX *)local_f0,data,len);
  pcVar1 = sha512_End((SHA512_CTX *)local_f0,(char *)context.buffer[0xf]);
  return pcVar1;
}

Assistant:

char* sha512_Data(const sha2_byte* data, size_t len, char digest[SHA512_DIGEST_STRING_LENGTH]) {
    trezor::SHA512_CTX	context;

	sha512_Init(&context);
	sha512_Update(&context, data, len);
	return sha512_End(&context, digest);
}